

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

QString * __thiscall
QDateTime::timeZoneAbbreviation(QString *__return_storage_ptr__,QDateTime *this)

{
  uint uVar1;
  qint64 millis;
  DaylightStatus dst;
  uint uVar2;
  QDateTimePrivate *pQVar3;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QArrayData *local_68;
  char16_t *pcStack_60;
  qsizetype local_58;
  QStringBuilder<QLatin1String,_QString> local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (this->d).d;
  if (((ulong)pQVar3 & 1) == 0) {
    uVar2 = (pQVar3->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
            super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    if ((uVar2 & 8) == 0) {
LAB_0034888f:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        return __return_storage_ptr__;
      }
      goto LAB_00348aa4;
    }
  }
  else {
    if (((ulong)pQVar3 & 8) == 0) goto LAB_0034888f;
    uVar2 = (uint)pQVar3;
  }
  switch(uVar2 >> 4 & 3) {
  case 0:
    if (((ulong)pQVar3 & 1) == 0) {
      millis = pQVar3->m_msecs;
      pQVar3 = (QDateTimePrivate *)
               (ulong)(pQVar3->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                      super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    }
    else {
      millis = (long)pQVar3 >> 8;
    }
    dst = DaylightTime;
    if (-1 < (char)pQVar3) {
      dst = (uint)(((uint)pQVar3 >> 6 & 1) != 0) + UnknownDaylightTime;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QDateTimePrivate::localNameAtMillis(__return_storage_ptr__,millis,dst);
      return __return_storage_ptr__;
    }
    goto LAB_00348aa4;
  case 1:
    ba.m_data = (storage_type *)&switchD_003488cc::switchdataD_0055cf10;
    ba.m_size = (qsizetype)"UTC";
    QString::fromLatin1((QString *)&local_48,(QString *)0x3,ba);
    (__return_storage_ptr__->d).d = (Data *)local_48.a.m_size;
    (__return_storage_ptr__->d).ptr = (char16_t *)local_48.a.m_data;
    (__return_storage_ptr__->d).size = (qsizetype)local_48.b.d.d;
    break;
  case 2:
    uVar2 = pQVar3->m_offsetFromUtc;
    uVar1 = -uVar2;
    if (0 < (int)uVar2) {
      uVar1 = uVar2;
    }
    QString::asprintf((char **)&local_68,"%c%02d%s%02d",(ulong)(((int)uVar2 >> 0x1f) * -2 + 0x2b),
                      (ulong)uVar1 / 0xe10,":",(ulong)(uVar1 / 0x3c + (uVar1 / 0xe10) * -0x3c));
    local_48.b.d.size = local_58;
    local_48.b.d.ptr = pcStack_60;
    local_48.b.d.d = (Data *)local_68;
    local_48.a.m_size = 3;
    local_48.a.m_data = "UTC";
    local_68 = (QArrayData *)0x0;
    pcStack_60 = (char16_t *)0x0;
    local_58 = 0;
    QStringBuilder<QLatin1String,_QString>::convertTo<QString>(__return_storage_ptr__,&local_48);
    if (&(local_48.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.b.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_68 != (QArrayData *)0x0) {
      LOCK();
      (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_68,2,0x10);
      }
    }
    break;
  case 3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QTimeZone::abbreviation(__return_storage_ptr__,&pQVar3->m_timeZone,this);
      return __return_storage_ptr__;
    }
    goto LAB_00348aa4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
LAB_00348aa4:
  __stack_chk_fail();
}

Assistant:

QString QDateTime::timeZoneAbbreviation() const
{
    if (!isValid())
        return QString();

    switch (getSpec(d)) {
    case Qt::UTC:
        return "UTC"_L1;
    case Qt::OffsetFromUTC:
        return "UTC"_L1 + toOffsetString(Qt::ISODate, d->m_offsetFromUtc);
    case Qt::TimeZone:
#if !QT_CONFIG(timezone)
        break;
#else
        Q_ASSERT(d->m_timeZone.isValid());
        return d->m_timeZone.abbreviation(*this);
#endif // timezone
    case Qt::LocalTime:
#if defined(Q_OS_WIN) && QT_CONFIG(timezone)
        // MS's tzname is a full MS-name, not an abbreviation:
        if (QString sys = QTimeZone::systemTimeZone().abbreviation(*this); !sys.isEmpty())
            return sys;
        // ... but, even so, a full name isn't as bad as empty.
#endif
        return QDateTimePrivate::localNameAtMillis(getMSecs(d),
                                                   extractDaylightStatus(getStatus(d)));
    }
    return QString();
}